

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

bool __thiscall
spirv_cross::ParsedIR::has_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  Meta *pMVar1;
  ulong uVar2;
  Bitset *pBVar3;
  Decoration local_1c;
  
  pMVar1 = find_meta(this,(ID)id.id);
  if ((pMVar1 == (Meta *)0x0) ||
     ((pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <= (ulong)index)
     ) {
    pBVar3 = &this->cleared_bitset;
  }
  else {
    pBVar3 = &(pMVar1->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[index].
              decoration_flags;
  }
  if (decoration < 0x40) {
    uVar2 = 1L << ((byte)decoration & 0x3f) & pBVar3->lower;
  }
  else {
    local_1c = decoration;
    uVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(pBVar3->higher)._M_h,&local_1c);
  }
  return uVar2 != 0;
}

Assistant:

bool ParsedIR::has_member_decoration(TypeID id, uint32_t index, Decoration decoration) const
{
	return get_member_decoration_bitset(id, index).get(decoration);
}